

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O1

err_t cmdStampSelfVal(void)

{
  octet *path;
  err_t eVar1;
  err_t eVar2;
  bool_t bVar3;
  size_t sVar4;
  octet *stamp;
  size_t count;
  size_t count_1;
  size_t local_38 [2];
  
  eVar1 = cmdSysModulePath((char *)0x0,local_38);
  if (eVar1 == 0) {
    sVar4 = strLen(".stamp");
    stamp = (octet *)blobCreate(local_38[0] + sVar4 + 0x14);
    if (stamp == (octet *)0x0) {
      eVar1 = 0x6e;
    }
    else {
      path = stamp + 0x14;
      eVar1 = cmdSysModulePath((char *)path,local_38);
      if ((eVar1 == 0) && (eVar1 = cmdFileStamp(stamp,(char *)path,1), eVar1 == 0xffffffff)) {
        local_38[1] = 10;
        sVar4 = strLen((char *)path);
        strCopy((char *)(path + sVar4),".stamp");
        eVar2 = cmdFileReadAll(stamp + 10,local_38 + 1,(char *)path);
        if (eVar2 == 0) {
          bVar3 = memEq(stamp,stamp + 10,10);
          eVar1 = 0xd2;
          if (bVar3 != 0) {
            eVar1 = 0;
          }
        }
        else {
          blobClose(stamp);
          eVar1 = eVar2;
        }
        if (eVar2 != 0) {
          return eVar2;
        }
      }
      blobClose(stamp);
    }
  }
  return eVar1;
}

Assistant:

err_t cmdStampSelfVal()
{
	const char* ext = ".stamp";
	err_t code;
	size_t count;
	void* stack;
	octet* stamp;
	octet* stamp1;
	char* name;
	// определить длину имени исполняемого модуля
	code = cmdSysModulePath(0, &count);
	ERR_CALL_CHECK(code);
	// выделить и разметить память
	code = cmdBlobCreate(stack, 10 + 10 + count + strLen(ext));
	ERR_CALL_CHECK(code);
	stamp = (octet*)stack;
	stamp1 = stamp + 10;
	name = (char*)(stamp1 + 10);
	// определить имя исполняемого модуля
	code = cmdSysModulePath(name, &count);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// проверить присоединенный штамп
	code = cmdFileStamp(stamp, name, TRUE);
	// в файле нет штампа?
	if (code == ERR_MAX)
	{
		size_t count = 10;
		// прочитать отсоединенный штамп
		strCopy(name + strLen(name), ext);
		code = cmdFileReadAll(stamp1, &count, name);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// проверить отсоединенный штамп
		if (!memEq(stamp, stamp1, 10))
			code = ERR_FILE_STAMP;
	}
	// завершить
	cmdBlobClose(stack);
	return code;
}